

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O1

int ssh2_channelcmp(void *av,void *bv)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(uint *)((long)bv + 0xc) <= *(uint *)((long)av + 0xc)) {
    uVar1 = (uint)(*(uint *)((long)bv + 0xc) < *(uint *)((long)av + 0xc));
  }
  return uVar1;
}

Assistant:

static int ssh2_channelcmp(void *av, void *bv)
{
    const struct ssh2_channel *a = (const struct ssh2_channel *) av;
    const struct ssh2_channel *b = (const struct ssh2_channel *) bv;
    if (a->localid < b->localid)
        return -1;
    if (a->localid > b->localid)
        return +1;
    return 0;
}